

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::~CFG(CFG *this)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_20;
  iterator ed;
  iterator it;
  CFG *this_local;
  
  this->_vptr_CFG = (_func_int **)&PTR__CFG_0013b9a0;
  if (this->m_entryNode != (CfgNode *)0x0) {
    (*this->m_entryNode->_vptr_CfgNode[1])();
  }
  if ((this->m_exitNode != (CfgNode *)0x0) && (this->m_exitNode != (CfgNode *)0x0)) {
    (*this->m_exitNode->_vptr_CfgNode[1])();
  }
  if ((this->m_haltNode != (CfgNode *)0x0) && (this->m_haltNode != (CfgNode *)0x0)) {
    (*this->m_haltNode->_vptr_CfgNode[1])();
  }
  ed = std::
       map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
       ::begin(&this->m_nodesMap);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
       ::end(&this->m_nodesMap);
  while (bVar1 = std::operator!=(&ed,&local_20), bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgNode_*>_>::operator->(&ed);
    if (ppVar2->second != (CfgNode *)0x0) {
      (*ppVar2->second->_vptr_CfgNode[1])();
    }
    std::_Rb_tree_iterator<std::pair<const_unsigned_long,_CfgNode_*>_>::operator++(&ed,0);
  }
  std::
  map<unsigned_long,_CfgNode_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_CfgNode_*>_>_>
  ::~map(&this->m_nodesMap);
  std::__cxx11::string::~string((string *)&this->m_functionName);
  return;
}

Assistant:

CFG::~CFG() {
	delete m_entryNode;

	if (m_exitNode)
		delete m_exitNode;

	if (m_haltNode)
		delete m_haltNode;

	for (std::map<Addr, CfgNode*>::iterator it = m_nodesMap.begin(),
			ed = m_nodesMap.end(); it != ed; it++) {
		delete it->second;
	}
}